

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O3

bool cmSetTargetPropertiesCommand::SetOneTarget
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf)

{
  cmTarget *this;
  pointer pbVar1;
  ulong uVar2;
  uint uVar3;
  
  this = cmMakefile::FindTargetToUse(mf,tname,false);
  if ((this != (cmTarget *)0x0) &&
     (pbVar1 = (propertyPairs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (propertyPairs->
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     )._M_impl.super__Vector_impl_data._M_finish != pbVar1)) {
    uVar3 = 2;
    uVar2 = 0;
    do {
      cmTarget::SetProperty(this,pbVar1 + uVar2,pbVar1[uVar3 - 1]._M_dataplus._M_p);
      cmTarget::CheckProperty
                (this,(propertyPairs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar2,mf);
      uVar2 = (ulong)uVar3;
      pbVar1 = (propertyPairs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 2;
    } while (uVar2 < (ulong)((long)(propertyPairs->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
    ;
  }
  return this != (cmTarget *)0x0;
}

Assistant:

bool cmSetTargetPropertiesCommand::SetOneTarget(
  const std::string& tname, std::vector<std::string>& propertyPairs,
  cmMakefile* mf)
{
  if (cmTarget* target = mf->FindTargetToUse(tname)) {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2) {
      target->SetProperty(propertyPairs[k], propertyPairs[k + 1].c_str());
      target->CheckProperty(propertyPairs[k], mf);
    }
  }
  // if file is not already in the makefile, then add it
  else {
    return false;
  }
  return true;
}